

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O2

KDataStream * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::Encode
          (KDataStream *__return_storage_ptr__,
          LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Encode(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream LE_Vector<Type>::Encode() const
{
    KDataStream stream;

    LE_Vector<Type>::Encode( stream );

    return stream;
}